

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M680XDisassembler.c
# Opt level: O2

void relative8_hdlr(MCInst *MI,m680x_info *info,uint16_t *address)

{
  byte bVar1;
  uint16_t address_00;
  cs_detail *pcVar2;
  uint uVar3;
  ulong in_RAX;
  ulong uStack_28;
  int16_t offset;
  
  uStack_28 = in_RAX & 0xffffffffffff;
  address_00 = *address;
  *address = address_00 + 1;
  read_byte_sign_extended(info,&offset,address_00);
  bVar1 = (info->m680x).op_count;
  (info->m680x).op_count = bVar1 + 1;
  (info->m680x).operands[bVar1].type = M680X_OP_RELATIVE;
  (info->m680x).operands[bVar1].size = '\0';
  (info->m680x).operands[bVar1].field_1.rel.offset = offset;
  (info->m680x).operands[bVar1].field_1.rel.address = offset + address_00 + 1;
  pcVar2 = MI->flat_insn->detail;
  if (pcVar2 != (cs_detail *)0x0) {
    bVar1 = pcVar2->groups_count;
    pcVar2->groups_count = bVar1 + 1;
    pcVar2->groups[bVar1] = '\a';
  }
  uVar3 = info->insn - M680X_INS_BRA;
  if ((uVar3 < 4) && (uVar3 != 2)) {
    return;
  }
  add_reg_to_rw_list(MI,M680X_REG_CC,READ);
  return;
}

Assistant:

static void relative8_hdlr(MCInst *MI, m680x_info *info, uint16_t *address)
{
	int16_t offset = 0;

	read_byte_sign_extended(info, &offset, (*address)++);
	add_rel_operand(info, offset, *address + offset);
	add_insn_group(MI->flat_insn->detail, M680X_GRP_BRAREL);

	if ((info->insn != M680X_INS_BRA) &&
		(info->insn != M680X_INS_BSR) &&
		(info->insn != M680X_INS_BRN))
		add_reg_to_rw_list(MI, M680X_REG_CC, READ);
}